

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O1

char * dfdToStringTransferFunction(khr_df_transfer_e value)

{
  if (value < (KHR_DF_TRANSFER_ACESCC|KHR_DF_TRANSFER_NTSC)) {
    return &DAT_003101d8 + *(int *)(&DAT_003101d8 + (ulong)value * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* dfdToStringTransferFunction(khr_df_transfer_e value) {
    switch (value) {
    case KHR_DF_TRANSFER_UNSPECIFIED:
        return "KHR_DF_TRANSFER_UNSPECIFIED";
    case KHR_DF_TRANSFER_LINEAR:
        return "KHR_DF_TRANSFER_LINEAR";
    case KHR_DF_TRANSFER_SRGB:
    // case KHR_DF_TRANSFER_SRGB_EOTF:
    // case KHR_DF_TRANSFER_SCRGB:
    // case KHR_DF_TRANSFER_SCRGB_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_SRGB";
    case KHR_DF_TRANSFER_ITU:
    // case KHR_DF_ITU_OETF:
    // case KHR_DF_TRANSFER_BT601:
    // case KHR_DF_TRANSFER_BT601_OETF:
    // case KHR_DF_TRANSFER_BT709:
    // case KHR_DF_TRANSFER_BT709_OETF:
    // case KHR_DF_TRANSFER_BT2020:
    // case KHR_DF_TRANSFER_BT2020_OETF:
    // case KHR_DF_TRANSFER_SMTPE170M:
    // case KHR_DF_TRANSFER_SMTPE170M_OETF:
    // case KHR_DF_TRANSFER_SMTPE170M_EOTF:
    // case KHR_DF_TRANSFER_SMTPE170M: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ITU";
    case KHR_DF_TRANSFER_NTSC:
    // case KHR_DF_TRANSFER_NTSC_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_NTSC";
    case KHR_DF_TRANSFER_SLOG:
    //case KHR_DF_TRANSFER_SLOG_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_SLOG";
    case KHR_DF_TRANSFER_SLOG2:
    // case KHR_DF_TRANSFER_SLOG2_OETF:
       return "KHR_DF_TRANSFER_SLOG2";
    case KHR_DF_TRANSFER_BT1886:
    // case KHR_DF_TRANSFER_BT1886_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_BT1886";
    case KHR_DF_TRANSFER_HLG_OETF:
        return "KHR_DF_TRANSFER_HLG_OETF";
    case KHR_DF_TRANSFER_HLG_EOTF:
        return "KHR_DF_TRANSFER_HLG_EOTF";
    case KHR_DF_TRANSFER_PQ_EOTF:
        return "KHR_DF_TRANSFER_PQ_EOTF";
    case KHR_DF_TRANSFER_PQ_OETF:
        return "KHR_DF_TRANSFER_PQ_OETF";
    case KHR_DF_TRANSFER_DCIP3:
    // case KHR_DF_TRANSFER_DCIP3_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_DCIP3";
    case KHR_DF_TRANSFER_PAL_OETF:
        return "KHR_DF_TRANSFER_PAL_OETF";
    case KHR_DF_TRANSFER_PAL625_EOTF:
        return "KHR_DF_TRANSFER_PAL625_EOTF";
    case KHR_DF_TRANSFER_ST240:
    // case KHR_DF_TRANSFER_ST240_EOTF:
    // case KHR_DF_TRANSFER_ST240_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ST240";
    case KHR_DF_TRANSFER_ACESCC:
    // case KHR_DF_TRANSFER_ACESCC_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ACESCC";
    case KHR_DF_TRANSFER_ACESCCT:
    // case KHR_DF_TRANSFER_ACESCCT_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ACESCCT";
    case KHR_DF_TRANSFER_ADOBERGB:
    // case KHR_DF_TRANSFER_ADOBERGB_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ADOBERGB";
    case KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF:
        return "KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF";

    case KHR_DF_TRANSFER_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}